

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O2

string * __thiscall
pfederc::ProgNameExpr::toString_abi_cxx11_(string *__return_storage_ptr__,ProgNameExpr *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  (*this->tok->_vptr_Token[2])(&local_30,this->tok,(this->super_Expr).lexer);
  std::operator+(__return_storage_ptr__,"use module ",&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string ProgNameExpr::toString() const noexcept {
  return "use module " + getToken().toString(getLexer());
}